

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parson.c
# Opt level: O0

JSON_Value * json_value_init_string_no_copy(char *string,size_t length)

{
  JSON_Value *new_value;
  size_t length_local;
  char *string_local;
  
  string_local = (char *)(*parson_malloc)(0x20);
  if (string_local == (char *)0x0) {
    string_local = (char *)0x0;
  }
  else {
    string_local[0] = '\0';
    string_local[1] = '\0';
    string_local[2] = '\0';
    string_local[3] = '\0';
    string_local[4] = '\0';
    string_local[5] = '\0';
    string_local[6] = '\0';
    string_local[7] = '\0';
    string_local[8] = '\x02';
    string_local[9] = '\0';
    string_local[10] = '\0';
    string_local[0xb] = '\0';
    *(char **)(string_local + 0x10) = string;
    *(size_t *)(string_local + 0x18) = length;
  }
  return (JSON_Value *)string_local;
}

Assistant:

static JSON_Value * json_value_init_string_no_copy(char *string, size_t length) {
    JSON_Value *new_value = (JSON_Value*)parson_malloc(sizeof(JSON_Value));
    if (!new_value) {
        return NULL;
    }
    new_value->parent = NULL;
    new_value->type = JSONString;
    new_value->value.string.chars = string;
    new_value->value.string.length = length;
    return new_value;
}